

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O2

QStringList * __thiscall
QNetworkAccessFileBackendFactory::supportedSchemes
          (QStringList *__return_storage_ptr__,QNetworkAccessFileBackendFactory *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48.d = (Data *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char16_t *)0x0;
  local_48.ptr = L"file";
  local_60.size = 0;
  local_48.size = 4;
  QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_48);
  local_78.d = (Data *)0x0;
  local_90.d = (Data *)0x0;
  local_90.ptr = (char16_t *)0x0;
  local_78.ptr = L"qrc";
  local_90.size = 0;
  local_78.size = 3;
  QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QNetworkAccessFileBackendFactory::supportedSchemes() const
{
    QStringList schemes;
    schemes << QStringLiteral("file")
            << QStringLiteral("qrc");
#if defined(Q_OS_ANDROID)
    schemes << QStringLiteral("assets");
#endif
    return schemes;
}